

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O2

PmError alsa_in_close(PmInternal *midi)

{
  undefined4 *ptr;
  int iVar1;
  int iVar2;
  PmError PVar3;
  
  ptr = (undefined4 *)midi->descriptor;
  if (ptr == (undefined4 *)0x0) {
    PVar3 = pmBadPtr;
  }
  else {
    iVar1 = snd_seq_disconnect_from(seq,ptr[2],*ptr,ptr[1]);
    pm_hosterror = iVar1;
    iVar2 = snd_seq_delete_port(seq,ptr[2]);
    if (iVar1 == 0) {
      pm_hosterror = iVar2;
    }
    alsa_unuse_queue();
    midi->descriptor = (void *)0x0;
    pm_free(ptr);
    if (pm_hosterror == 0) {
      PVar3 = pmNoData;
    }
    else {
      get_alsa_error_text(pm_hosterror_text,0x100,pm_hosterror);
      PVar3 = pmHostError;
    }
  }
  return PVar3;
}

Assistant:

static PmError alsa_in_close(PmInternal *midi)
{
    alsa_descriptor_type desc = (alsa_descriptor_type) midi->descriptor;
    if (!desc) return pmBadPtr;
    if ((pm_hosterror = snd_seq_disconnect_from(seq, desc->this_port, 
                                                desc->client, desc->port))) {
        snd_seq_delete_port(seq, desc->this_port); /* try to close port */
    } else {
        pm_hosterror = snd_seq_delete_port(seq, desc->this_port);
    }
    alsa_unuse_queue();
    midi->descriptor = NULL;
    pm_free(desc);
    if (pm_hosterror) {
        get_alsa_error_text(pm_hosterror_text, PM_HOST_ERROR_MSG_LEN, 
                            pm_hosterror);
        return pmHostError;
    }
    return pmNoError;
}